

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall Camera::Camera(Camera *this)

{
  Image *this_00;
  float fVar1;
  int local_60 [5];
  tvec3<float> local_4c;
  int local_40 [3];
  tvec3<float> local_34;
  int local_28 [3];
  tvec3<float> local_1c;
  Camera *local_10;
  Camera *this_local;
  
  local_10 = this;
  glm::detail::tvec3<float>::tvec3(&this->position);
  glm::detail::tvec3<float>::tvec3(&this->up);
  glm::detail::tvec3<float>::tvec3(&this->lookAt);
  local_28[2] = 0;
  local_28[1] = 0;
  local_28[0] = 0;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_1c,local_28 + 2,local_28 + 1,local_28);
  glm::detail::tvec3<float>::operator=(&this->position,&local_1c);
  local_40[2] = 0;
  local_40[1] = 1;
  local_40[0] = 0;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_34,local_40 + 2,local_40 + 1,local_40);
  glm::detail::tvec3<float>::operator=(&this->up,&local_34);
  local_60[4] = 0;
  local_60[3] = 0;
  local_60[2] = 0xffffffff;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_4c,local_60 + 4,local_60 + 3,local_60 + 2);
  glm::detail::tvec3<float>::operator=(&this->lookAt,&local_4c);
  fVar1 = glm::quarter_pi<float>();
  this->fovX = fVar1;
  this->fovY = (this->fovX * 600.0) / 800.0;
  this_00 = (Image *)operator_new(0x10);
  local_60[1] = 800;
  local_60[0] = 600;
  Image::Image(this_00,local_60 + 1,local_60);
  this->outputImage = this_00;
  return;
}

Assistant:

Camera::Camera() {
    position = glm::vec3(0, 0, 0);
    up = glm::vec3(0, 1, 0);
    lookAt = glm::vec3(0, 0, -1);
    fovX = glm::quarter_pi<float>();
    fovY = fovX * 600.0 / 800.0;
    outputImage = new Image(800, 600);
}